

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sproxy.cpp
# Opt level: O1

bool process_arguments(int argc,char **argv)

{
  int iVar1;
  string *psVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  
  if (1 < argc) {
    iVar3 = 1;
    do {
      pcVar5 = argv[iVar3];
      iVar1 = strcmp("-c",pcVar5);
      pcVar4 = (char *)config_filename_abi_cxx11_._M_string_length;
      if ((iVar1 == 0) && (iVar3 + 1 < argc)) {
        pcVar5 = argv[iVar3 + 1];
        strlen(pcVar5);
        psVar2 = &config_filename_abi_cxx11_;
LAB_00105d78:
        iVar3 = iVar3 + 1;
        std::__cxx11::string::_M_replace((ulong)psVar2,0,pcVar4,(ulong)pcVar5);
      }
      else {
        iVar1 = strcmp("-D",pcVar5);
        if (iVar1 != 0) {
          iVar1 = strcmp("-d",pcVar5);
          pcVar4 = (char *)default_filename_abi_cxx11_._M_string_length;
          if ((iVar1 == 0) && (iVar3 + 1 < argc)) {
            pcVar5 = argv[iVar3 + 1];
            strlen(pcVar5);
            psVar2 = &default_filename_abi_cxx11_;
          }
          else {
            iVar1 = strcmp("-i",pcVar5);
            if (((iVar1 == 0) && (iVar3 + 1 < argc)) ||
               ((iVar1 = strcmp("-l",pcVar5), iVar1 == 0 && (iVar3 + 1 < argc)))) {
              pcVar4 = (char *)interface_name_abi_cxx11_._M_string_length;
              pcVar5 = argv[iVar3 + 1];
              strlen(pcVar5);
              psVar2 = &interface_name_abi_cxx11_;
            }
            else {
              iVar1 = strcmp("--pidfile",pcVar5);
              pcVar4 = (char *)pid_filename_abi_cxx11_._M_string_length;
              if ((iVar1 != 0) || (argc <= iVar3 + 1)) goto LAB_00105d8b;
              pcVar5 = argv[iVar3 + 1];
              strlen(pcVar5);
              psVar2 = &pid_filename_abi_cxx11_;
            }
          }
          goto LAB_00105d78;
        }
        daemonize = true;
      }
LAB_00105d8b:
      iVar3 = iVar3 + 1;
    } while (iVar3 < argc);
  }
  return true;
}

Assistant:

bool process_arguments(int argc, char** argv)
{
  // Loop over all the arguments, and process them
  for (int arg = 1; arg < argc; arg++)
  {
    // Argument -c specifies the config file filename
    if (strcmp("-c", argv[arg]) == 0 && arg + 1 < argc)
    {
      arg++;

      config_filename = argv[arg];
    }
    // Argument -D indicates this process should daemonize itself
    else if (strcmp("-D", argv[arg]) == 0)
    {
      daemonize = true;
    }
    // Argument -d specifies the default file filename
    else if (strcmp("-d", argv[arg]) == 0 && arg + 1 < argc)
    {
      arg++;

      default_filename = argv[arg];
    }
    // Argument -i specifies an interface to monitor
    else if (strcmp("-i", argv[arg]) == 0 && arg + 1 < argc)
    {
      arg++;

      interface_name = argv[arg];
    }
    // Argument -l specifies the log file filename
    else if (strcmp("-l", argv[arg]) == 0 && arg + 1 < argc)
    {
      arg++;

      interface_name = argv[arg];
    }
    else if (strcmp("--pidfile", argv[arg]) == 0 && arg + 1 < argc)
    {
      arg++;

      pid_filename = argv[arg];
    }

  }

  // If execution reaches here there was an acceptable set of arguments provided
  return true;
}